

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joysticks.c
# Opt level: O0

void drop_callback(GLFWwindow *window,int count,char **paths)

{
  FILE *__stream;
  size_t __n;
  char *string;
  size_t sVar1;
  FILE *stream;
  char *text;
  long size;
  int i;
  char **paths_local;
  int count_local;
  GLFWwindow *window_local;
  
  for (size._4_4_ = 0; size._4_4_ < count; size._4_4_ = size._4_4_ + 1) {
    __stream = fopen(paths[size._4_4_],"rb");
    if (__stream != (FILE *)0x0) {
      fseek(__stream,0,2);
      __n = ftell(__stream);
      fseek(__stream,0,0);
      string = (char *)malloc(__n + 1);
      string[__n] = '\0';
      sVar1 = fread(string,1,__n,__stream);
      if (sVar1 == __n) {
        glfwUpdateGamepadMappings(string);
      }
      free(string);
      fclose(__stream);
    }
  }
  return;
}

Assistant:

static void drop_callback(GLFWwindow* window, int count, const char* paths[])
{
    int i;

    for (i = 0;  i < count;  i++)
    {
        long size;
        char* text;
        FILE* stream = fopen(paths[i], "rb");
        if (!stream)
            continue;

        fseek(stream, 0, SEEK_END);
        size = ftell(stream);
        fseek(stream, 0, SEEK_SET);

        text = malloc(size + 1);
        text[size] = '\0';
        if (fread(text, 1, size, stream) == size)
            glfwUpdateGamepadMappings(text);

        free(text);
        fclose(stream);
    }
}